

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

EffectiveSign __thiscall
slang::ast::BinaryExpression::getEffectiveSignImpl(BinaryExpression *this,bool isForConversion)

{
  EffectiveSign EVar1;
  EffectiveSign right;
  
  if ((0x7ffe00U >> (this->op & (LogicalShiftRight|BinaryXor)) & 1) != 0) {
    return Either;
  }
  if ((0x1ffU >> (this->op & (LogicalShiftRight|BinaryXor)) & 1) != 0) {
    EVar1 = Expression::getEffectiveSign(this->left_,isForConversion);
    right = Expression::getEffectiveSign(this->right_,isForConversion);
    EVar1 = Expression::conjunction(EVar1,right);
    return EVar1;
  }
  EVar1 = Expression::getEffectiveSign(this->left_,isForConversion);
  return EVar1;
}

Assistant:

Expression::EffectiveSign BinaryExpression::getEffectiveSignImpl(bool isForConversion) const {
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
        case BinaryOperator::Divide:
        case BinaryOperator::Mod:
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            return conjunction(left().getEffectiveSign(isForConversion),
                               right().getEffectiveSign(isForConversion));
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            return EffectiveSign::Either;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
        case BinaryOperator::Power:
            return left().getEffectiveSign(isForConversion);
    }
    SLANG_UNREACHABLE;
}